

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# one-of.h
# Opt level: O3

bool kj::operator==(OneOf<int,_bool> *a,OneOf<int,_bool> *b)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  
  uVar1 = a->tag;
  uVar2 = b->tag;
  bVar3 = true;
  if (uVar1 != 0 || uVar2 != 0) {
    bVar3 = false;
    if ((uVar1 == uVar2) && ((uVar1 == 0) != (uVar2 != 0))) {
      bVar3 = true;
      if (*(int *)&a->field_1 != *(int *)&b->field_1 || uVar1 != 1) {
        return (char)*(int *)&a->field_1 == (char)*(int *)&b->field_1 && uVar1 == 2;
      }
    }
  }
  return bVar3;
}

Assistant:

inline bool operator==(decltype(nullptr)) const { return tag == 0; }